

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O0

void sift_down(int i)

{
  node_pair nVar1;
  int iVar2;
  node_pair tmp;
  int j;
  int right;
  int left;
  int i_local;
  
  j = i * 2;
  right = i;
  while( true ) {
    tmp.node2 = j + 1;
    if (heap_size < j) {
      return;
    }
    if ((j == heap_size) || (iVar2 = in_heap_order(j,tmp.node2), iVar2 != 0)) {
      tmp.node1 = j;
    }
    else {
      tmp.node1 = tmp.node2;
    }
    iVar2 = in_heap_order(tmp.node1,right);
    if (iVar2 == 0) break;
    nVar1 = heap[tmp.node1];
    heap[tmp.node1] = heap[right];
    heap[right] = nVar1;
    right = tmp.node1;
    j = tmp.node1 * 2;
  }
  return;
}

Assistant:

void sift_down(int i)
{
  int left, right, j;
  node_pair tmp;

  left = i*2;
  right = left+1;

  while (left <= heap_size) {
    if (left == heap_size || in_heap_order(left, right)) {
      j = left;
    } else {
      j = right;
    }
    if (in_heap_order(j, i)) {
      tmp = heap[j];
      heap[j] = heap[i];
      heap[i] = tmp;
      i = j;
      left = i*2;
      right = left+1;
    } else {
      break;
    }
  }
}